

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_sps.c
# Opt level: O0

void recycle_subsps(H264_subSPS_t *subset_sps)

{
  int iVar1;
  int local_14;
  RK_S32 num_views;
  RK_S32 i;
  H264_subSPS_t *subset_sps_local;
  
  iVar1 = subset_sps->num_views_minus1 + 1;
  for (local_14 = 1; local_14 < iVar1; local_14 = local_14 + 1) {
    if (0 < subset_sps->num_anchor_refs_l0[local_14]) {
      if (subset_sps->anchor_ref_l0[local_14] != (RK_S32 *)0x0) {
        mpp_osal_free("recycle_subsps",subset_sps->anchor_ref_l0[local_14]);
      }
      subset_sps->anchor_ref_l0[local_14] = (RK_S32 *)0x0;
    }
    if (0 < subset_sps->num_anchor_refs_l1[local_14]) {
      if (subset_sps->anchor_ref_l1[local_14] != (RK_S32 *)0x0) {
        mpp_osal_free("recycle_subsps",subset_sps->anchor_ref_l1[local_14]);
      }
      subset_sps->anchor_ref_l1[local_14] = (RK_S32 *)0x0;
    }
    if (0 < subset_sps->num_non_anchor_refs_l0[local_14]) {
      if (subset_sps->non_anchor_ref_l0[local_14] != (RK_S32 *)0x0) {
        mpp_osal_free("recycle_subsps",subset_sps->non_anchor_ref_l0[local_14]);
      }
      subset_sps->non_anchor_ref_l0[local_14] = (RK_S32 *)0x0;
    }
    if (0 < subset_sps->num_non_anchor_refs_l1[local_14]) {
      if (subset_sps->non_anchor_ref_l1[local_14] != (RK_S32 *)0x0) {
        mpp_osal_free("recycle_subsps",subset_sps->non_anchor_ref_l1[local_14]);
      }
      subset_sps->non_anchor_ref_l1[local_14] = (RK_S32 *)0x0;
    }
  }
  if (0 < iVar1) {
    if (subset_sps->view_id != (RK_S32 *)0x0) {
      mpp_osal_free("recycle_subsps",subset_sps->view_id);
    }
    subset_sps->view_id = (RK_S32 *)0x0;
    if (subset_sps->num_anchor_refs_l0 != (RK_S32 *)0x0) {
      mpp_osal_free("recycle_subsps",subset_sps->num_anchor_refs_l0);
    }
    subset_sps->num_anchor_refs_l0 = (RK_S32 *)0x0;
    if (subset_sps->num_anchor_refs_l1 != (RK_S32 *)0x0) {
      mpp_osal_free("recycle_subsps",subset_sps->num_anchor_refs_l1);
    }
    subset_sps->num_anchor_refs_l1 = (RK_S32 *)0x0;
    if (subset_sps->anchor_ref_l0 != (RK_S32 **)0x0) {
      mpp_osal_free("recycle_subsps",subset_sps->anchor_ref_l0);
    }
    subset_sps->anchor_ref_l0 = (RK_S32 **)0x0;
    if (subset_sps->anchor_ref_l1 != (RK_S32 **)0x0) {
      mpp_osal_free("recycle_subsps",subset_sps->anchor_ref_l1);
    }
    subset_sps->anchor_ref_l1 = (RK_S32 **)0x0;
    if (subset_sps->num_non_anchor_refs_l0 != (RK_S32 *)0x0) {
      mpp_osal_free("recycle_subsps",subset_sps->num_non_anchor_refs_l0);
    }
    subset_sps->num_non_anchor_refs_l0 = (RK_S32 *)0x0;
    if (subset_sps->num_non_anchor_refs_l1 != (RK_S32 *)0x0) {
      mpp_osal_free("recycle_subsps",subset_sps->num_non_anchor_refs_l1);
    }
    subset_sps->num_non_anchor_refs_l1 = (RK_S32 *)0x0;
    if (subset_sps->non_anchor_ref_l0 != (RK_S32 **)0x0) {
      mpp_osal_free("recycle_subsps",subset_sps->non_anchor_ref_l0);
    }
    subset_sps->non_anchor_ref_l0 = (RK_S32 **)0x0;
    if (subset_sps->non_anchor_ref_l1 != (RK_S32 **)0x0) {
      mpp_osal_free("recycle_subsps",subset_sps->non_anchor_ref_l1);
    }
    subset_sps->non_anchor_ref_l1 = (RK_S32 **)0x0;
  }
  subset_sps->Valid = 0;
  return;
}

Assistant:

void recycle_subsps(H264_subSPS_t *subset_sps)
{
    RK_S32 i = 0, num_views = 0;

    num_views = 1 + subset_sps->num_views_minus1;
    for (i = 1; i < num_views; i++) {
        if (subset_sps->num_anchor_refs_l0[i] > 0) {
            MPP_FREE(subset_sps->anchor_ref_l0[i]);
        }
        if (subset_sps->num_anchor_refs_l1[i] > 0) {
            MPP_FREE(subset_sps->anchor_ref_l1[i]);
        }
        if (subset_sps->num_non_anchor_refs_l0[i] > 0) {
            MPP_FREE(subset_sps->non_anchor_ref_l0[i]);
        }
        if (subset_sps->num_non_anchor_refs_l1[i] > 0) {
            MPP_FREE(subset_sps->non_anchor_ref_l1[i]);
        }
    }
    if (num_views > 0) {
        MPP_FREE(subset_sps->view_id);
        MPP_FREE(subset_sps->num_anchor_refs_l0);
        MPP_FREE(subset_sps->num_anchor_refs_l1);
        MPP_FREE(subset_sps->anchor_ref_l0);
        MPP_FREE(subset_sps->anchor_ref_l1);
        MPP_FREE(subset_sps->num_non_anchor_refs_l0);
        MPP_FREE(subset_sps->num_non_anchor_refs_l1);
        MPP_FREE(subset_sps->non_anchor_ref_l0);
        MPP_FREE(subset_sps->non_anchor_ref_l1);
    }
    subset_sps->Valid = 0;
}